

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O2

int __thiscall
CVmObjDate::add_val(CVmObjDate *this,vm_val_t *result,vm_obj_id_t param_2,vm_val_t *val)

{
  int *piVar1;
  int32_t iVar2;
  vm_obj_id_t vVar3;
  int daytime;
  int iVar4;
  double dVar5;
  int local_70;
  int local_6c;
  bignum_t<32> d;
  bignum_t<32> local_52;
  bignum_t<32> local_3d;
  
  piVar1 = (int *)(this->super_CVmObject).ext_;
  iVar4 = *piVar1;
  daytime = piVar1[1];
  if (val->typ == VM_INT) {
    iVar4 = iVar4 + (val->val).obj;
  }
  else {
    bignum_t<32>::bignum_t(&d,val);
    dVar5 = CVmObjBigNum::ext_to_double(d.ext);
    dVar5 = floor(dVar5);
    if ((2147483647.0 < (double)iVar4 + dVar5) || ((double)iVar4 + dVar5 < -2147483648.0)) {
      err_throw(0x7e7);
    }
    local_6c = iVar4 + (int)dVar5;
    bignum_t<32>::operator-(&local_52,&d,dVar5);
    bignum_t<32>::operator*(&local_3d,&local_52,86400000);
    dVar5 = CVmObjBigNum::ext_to_double(local_3d.ext);
    iVar2 = round_int32(dVar5);
    local_70 = iVar2 + daytime;
    caldate_t::normalize(&local_6c,&local_70);
    daytime = local_70;
    iVar4 = local_6c;
  }
  vVar3 = create(0,iVar4,daytime);
  result->typ = VM_OBJ;
  (result->val).obj = vVar3;
  return 1;
}

Assistant:

int CVmObjDate::add_val(VMG_ vm_val_t *result, vm_obj_id_t /*self*/,
                        const vm_val_t *val)
{
    /* get my date and time */
    int32_t dayno = get_ext()->dayno;
    int32_t daytime = get_ext()->daytime;
    
    /* the other value must be something numeric */
    if (val->typ == VM_INT)
    {
        /* it's a simple integer - add it as a number of days */
        dayno += val->val.intval;
    }
    else
    {
        /* it's not an int; calculate in the bignum domain */
        bignum_t<32>d(vmg_ val);

        /* make sure the integer portion won't overflow */
        double dd = floor((double)d);
        if (dd + dayno > INT32MAXVAL || dd + dayno < INT32MINVAL)
            err_throw(VMERR_NUM_OVERFLOW);

        /* add the whole part to my day number */
        dayno += (int32_t)dd;

        /* 
         *   convert the fractional part to milliseconds (by multiplying it
         *   by the number of milliseconds in a day), then add it to my time
         *   value 
         */
        daytime += round_int32((double)((d - dd) * (long)(24L*60*60*1000)));

        /* normalize, to carry time overflow/underflow into the date */
        caldate_t::normalize(dayno, daytime);
    }

    /* return a new Date object representing the result */
    result->set_obj(create(vmg_ FALSE, dayno, daytime));

    /* handled */
    return TRUE;
}